

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatrix.h
# Opt level: O2

void chrono::PasteMatrix(ChSparseMatrix *matrTo,ChMatrixConstRef matrFrom,int insrow,int inscol,
                        bool overwrite)

{
  int j;
  long lVar1;
  undefined3 in_register_00000081;
  long lVar2;
  
  if (CONCAT31(in_register_00000081,overwrite) == 0) {
    for (lVar2 = 0;
        lVar2 < (matrFrom->
                super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_rows.m_value; lVar2 = lVar2 + 1) {
      for (lVar1 = 0;
          lVar1 < (matrFrom->
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  ).
                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_cols.m_value; lVar1 = lVar1 + 1) {
        Eigen::
        DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
        ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                      *)matrFrom,lVar2,lVar1);
        (**matrTo->_vptr_SparseMatrix)
                  (matrTo,(ulong)(uint)((int)lVar2 + insrow),(ulong)(uint)(inscol + (int)lVar1),0);
      }
    }
  }
  else {
    for (lVar2 = 0;
        lVar2 < (matrFrom->
                super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_rows.m_value; lVar2 = lVar2 + 1) {
      for (lVar1 = 0;
          lVar1 < (matrFrom->
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  ).
                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_cols.m_value; lVar1 = lVar1 + 1) {
        Eigen::
        DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
        ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                      *)matrFrom,lVar2,lVar1);
        (**matrTo->_vptr_SparseMatrix)
                  (matrTo,(ulong)(uint)((int)lVar2 + insrow),(ulong)(uint)(inscol + (int)lVar1),1);
      }
    }
  }
  return;
}

Assistant:

inline void PasteMatrix(ChSparseMatrix& matrTo,
                        ChMatrixConstRef matrFrom,
                        int insrow,
                        int inscol,
                        bool overwrite = true) {
    if (overwrite) {
        for (auto i = 0; i < matrFrom.rows(); i++) {
            for (auto j = 0; j < matrFrom.cols(); j++) {
                matrTo.SetElement(insrow + i, inscol + j, matrFrom(i, j), true);
            }
        }
    } else {
        for (auto i = 0; i < matrFrom.rows(); i++) {
            for (auto j = 0; j < matrFrom.cols(); j++) {
                matrTo.SetElement(insrow + i, inscol + j, matrFrom(i, j), false);
            }
        }
    }
}